

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O2

size_t __thiscall adios2::format::BP4Serializer::CloseData(BP4Serializer *this,IO *io)

{
  mapped_type mVar1;
  _func_int **pp_Var2;
  mapped_type *pmVar3;
  _func_int *p_Var4;
  size_t sVar5;
  allocator local_81;
  key_type local_80;
  string local_60;
  string local_40;
  
  p_Var4 = (this->super_BP4Base)._vptr_BP4Base[-3];
  std::__cxx11::string::string((string *)&local_40,"buffering",(allocator *)&local_80);
  profiling::IOChrono::Start
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var4),&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  p_Var4 = (this->super_BP4Base)._vptr_BP4Base[-3];
  sVar5 = *(size_t *)(p_Var4 + 0x20 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
  if ((&(this->super_BP4Base).field_0x270)[(long)p_Var4] == '\0') {
    if ((&(this->super_BP4Base).field_0x1c0)[(long)p_Var4] == '\x01') {
      SerializeDataBuffer(this,io);
      sVar5 = *(size_t *)
               ((this->super_BP4Base)._vptr_BP4Base[-3] + 0x20 +
               (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
    }
    SerializeMetadataInData(this,false,false);
    p_Var4 = (this->super_BP4Base)._vptr_BP4Base[-3];
    if ((&(this->super_BP4Base).field_0x2e8)[(long)p_Var4] == '\x01') {
      mVar1 = *(mapped_type *)
               (p_Var4 + 0x28 + (long)&(this->super_BP4Base).m_MetadataIndex.super_Buffer);
      std::__cxx11::string::string((string *)&local_80,"buffering",&local_81);
      pmVar3 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::at((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     *)(&(this->super_BP4Base).field_0x2b0 + (long)p_Var4),&local_80);
      *pmVar3 = mVar1;
      std::__cxx11::string::~string((string *)&local_80);
      p_Var4 = (this->super_BP4Base)._vptr_BP4Base[-3];
    }
    aggregator::MPIChain::Close((MPIChain *)(&(this->super_BP4Base).field_0x2f8 + (long)p_Var4));
    pp_Var2 = (this->super_BP4Base)._vptr_BP4Base;
    (&(this->super_BP4Base).field_0x270)[(long)pp_Var2[-3]] = 1;
    p_Var4 = pp_Var2[-3];
  }
  std::__cxx11::string::string((string *)&local_60,"buffering",(allocator *)&local_80);
  profiling::IOChrono::Stop
            ((IOChrono *)(&(this->super_BP4Base).field_0x278 + (long)p_Var4),&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return sVar5;
}

Assistant:

size_t BP4Serializer::CloseData(core::IO &io)
{
    m_Profiler.Start("buffering");
    size_t dataEndsAt = m_Data.m_Position;
    if (!m_IsClosed)
    {
        if (m_MetadataSet.DataPGIsOpen)
        {
            SerializeDataBuffer(io);
        }
        dataEndsAt = m_Data.m_Position;

        SerializeMetadataInData(false, false);

        if (m_Profiler.m_IsActive)
        {
            m_Profiler.m_Bytes.at("buffering") = m_Data.m_AbsolutePosition;
        }

        m_Aggregator.Close();
        m_IsClosed = true;
    }

    m_Profiler.Stop("buffering");
    return dataEndsAt;
}